

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall spirv_cross::Compiler::flush_dependees(Compiler *this,SPIRVariable *var)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 uStack_38;
  
  pTVar1 = (var->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (var->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  uStack_38 = in_RAX;
  for (lVar3 = 0; sVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    uStack_38 = CONCAT44(*(undefined4 *)((long)&pTVar1->id + lVar3),(undefined4)uStack_38);
    ::std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&this->invalid_expressions,(value_type *)((long)&uStack_38 + 4));
  }
  (var->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
  return;
}

Assistant:

void Compiler::flush_dependees(SPIRVariable &var)
{
	for (auto expr : var.dependees)
		invalid_expressions.insert(expr);
	var.dependees.clear();
}